

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,string *arg_lang)

{
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  cmake *this_00;
  char *pcVar4;
  pointer pcVar5;
  undefined4 extraout_var;
  reference this_01;
  pointer this_02;
  Value *pVVar6;
  reference pcVar7;
  reference this_03;
  reference __k;
  mapped_type *pmVar8;
  pointer ppVar9;
  string *psVar10;
  const_iterator cVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  undefined1 local_12c0 [8];
  cmGeneratedFileStream tmf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  undefined1 local_1018 [8];
  string target_mods_file;
  _Self local_fe8;
  _Self local_fe0;
  iterator mit;
  string *r;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  string *p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  cmDyndepObjectInfo *object_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *__range1_3;
  string local_f70;
  undefined1 local_f50 [8];
  cmNinjaBuild build;
  cmGeneratedFileStream ddf;
  undefined1 local_bd8 [8];
  string mod;
  string *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmDyndepObjectInfo *object;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *__range1_2;
  Value tm;
  string local_b28;
  string local_b08;
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [8];
  iterator i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  undefined1 local_a68 [8];
  Reader reader_1;
  ifstream ltmf;
  undefined1 local_750 [8];
  Value ltm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  undefined1 local_6e8 [8];
  string ltmn;
  string *linked_target_dir;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  Value *ddi_require;
  undefined1 local_640 [8];
  const_iterator __end3_1;
  undefined1 local_620 [8];
  const_iterator __begin3_1;
  Value *__range3_1;
  Value *ddi_requires;
  reference local_5e0;
  Value *ddi_provide;
  undefined1 local_5d0;
  undefined1 local_5c8 [8];
  const_iterator __end3;
  undefined1 local_5a8 [8];
  const_iterator __begin3;
  Value *__range3;
  Value *ddi_provides;
  undefined1 local_568 [8];
  cmDyndepObjectInfo info;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  Reader reader;
  ifstream ddif;
  Value *ddi;
  Value ddio;
  string *arg_ddi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> objects;
  pointer local_128 [3];
  unique_ptr<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>_> local_110;
  unique_ptr<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>_> lgd;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_100;
  __single_object mfd;
  cmStateDirectory local_d0;
  cmStateDirectory local_a8;
  cmStateDirectory local_80;
  undefined1 local_58 [8];
  cmStateSnapshot snapshot;
  string *arg_dd_local;
  string *dir_cur_bld_local;
  string *dir_cur_src_local;
  string *dir_top_bld_local;
  string *dir_top_src_local;
  cmGlobalNinjaGenerator *this_local;
  
  snapshot.Position.Position = (PositionType)arg_dd;
  this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_58,this_00);
  cmStateSnapshot::GetDirectory(&local_80,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentSource(&local_80,dir_cur_src);
  cmStateSnapshot::GetDirectory(&local_a8,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentBinary(&local_a8,dir_cur_bld);
  cmStateSnapshot::GetDirectory(&local_d0,(cmStateSnapshot *)local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmStateDirectory::SetRelativePathTopSource(&local_d0,pcVar4);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&mfd,(cmStateSnapshot *)local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)&mfd,pcVar4);
  lgd._M_t.super___uniq_ptr_impl<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>_>
  ._M_t.super__Tuple_impl<0UL,_cmLocalNinjaGenerator_*,_std::default_delete<cmLocalNinjaGenerator>_>
  .super__Head_base<0UL,_cmLocalNinjaGenerator_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>,_true,_true>
        )(__uniq_ptr_data<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>,_true,_true>
          )this;
  std::make_unique<cmMakefile,cmGlobalNinjaGenerator*,cmStateSnapshot&>
            ((cmGlobalNinjaGenerator **)&local_100,(cmStateSnapshot *)&lgd);
  pcVar5 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_100);
  iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2]
          )(this,pcVar5);
  std::unique_ptr<cmLocalNinjaGenerator,std::default_delete<cmLocalNinjaGenerator>>::
  unique_ptr<std::default_delete<cmLocalNinjaGenerator>,void>
            ((unique_ptr<cmLocalNinjaGenerator,std::default_delete<cmLocalNinjaGenerator>> *)
             &local_110,(pointer)CONCAT44(extraout_var,iVar2));
  local_128[0] = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::release(&local_100);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
            (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,local_128);
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::unique_ptr<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>_>
                ::release(&local_110);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
            (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (value_type *)
             &objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<cmLocalNinjaGenerator,_std::default_delete<cmLocalNinjaGenerator>_>::~unique_ptr
            (&local_110);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_100);
  std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::vector
            ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(arg_ddis);
  arg_ddi = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(arg_ddis);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg_ddi), bVar1) {
    ddio.limit_ = (ptrdiff_t)
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    Json::Value::Value((Value *)&ddi,nullValue);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&reader.features_,pcVar4,_Var3);
    Json::Reader::Reader((Reader *)local_4b0);
    bVar1 = Json::Reader::parse((Reader *)local_4b0,(istream *)&reader.features_,(Value *)&ddi,false
                               );
    if (bVar1) {
      cmDyndepObjectInfo::cmDyndepObjectInfo((cmDyndepObjectInfo *)local_568);
      pVVar6 = Json::Value::operator[]((Value *)&ddi,"object");
      Json::Value::asString_abi_cxx11_((string *)&ddi_provides,pVVar6);
      std::__cxx11::string::operator=((string *)local_568,(string *)&ddi_provides);
      std::__cxx11::string::~string((string *)&ddi_provides);
      pVVar6 = Json::Value::operator[]((Value *)&ddi,"provides");
      bVar1 = Json::Value::isArray(pVVar6);
      if (bVar1) {
        __begin3.super_ValueIteratorBase._8_8_ = pVVar6;
        cVar11 = Json::Value::begin(pVVar6);
        __end3.super_ValueIteratorBase._8_8_ = cVar11.super_ValueIteratorBase.current_._M_node;
        __begin3.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar11.super_ValueIteratorBase.isNull_;
        local_5a8 = (undefined1  [8])__end3.super_ValueIteratorBase._8_8_;
        cVar11 = Json::Value::end((Value *)__begin3.super_ValueIteratorBase._8_8_);
        ddi_provide = (Value *)cVar11.super_ValueIteratorBase.current_._M_node;
        local_5d0 = cVar11.super_ValueIteratorBase.isNull_;
        local_5c8 = (undefined1  [8])ddi_provide;
        __end3.super_ValueIteratorBase.current_._M_node._0_1_ = local_5d0;
        while (bVar1 = Json::ValueIteratorBase::operator!=
                                 ((ValueIteratorBase *)local_5a8,(SelfType *)local_5c8), bVar1) {
          local_5e0 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_5a8);
          Json::Value::asString_abi_cxx11_((string *)&ddi_requires,local_5e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&info.Object.field_2 + 8),(value_type *)&ddi_requires);
          std::__cxx11::string::~string((string *)&ddi_requires);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_5a8);
        }
      }
      pVVar6 = Json::Value::operator[]((Value *)&ddi,"requires");
      bVar1 = Json::Value::isArray(pVVar6);
      if (bVar1) {
        __begin3_1.super_ValueIteratorBase._8_8_ = pVVar6;
        cVar11 = Json::Value::begin(pVVar6);
        __end3_1.super_ValueIteratorBase._8_8_ = cVar11.super_ValueIteratorBase.current_._M_node;
        __begin3_1.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar11.super_ValueIteratorBase.isNull_;
        local_620 = (undefined1  [8])__end3_1.super_ValueIteratorBase._8_8_;
        cVar11 = Json::Value::end((Value *)__begin3_1.super_ValueIteratorBase._8_8_);
        local_640 = (undefined1  [8])cVar11.super_ValueIteratorBase.current_._M_node;
        __end3_1.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar11.super_ValueIteratorBase.isNull_;
        while (bVar1 = Json::ValueIteratorBase::operator!=
                                 ((ValueIteratorBase *)local_620,(SelfType *)local_640), bVar1) {
          this_01 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_620);
          Json::Value::asString_abi_cxx11_
                    ((string *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count,this_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&info.Provides.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string
                    ((string *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_620);
        }
      }
      std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::push_back
                ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1,
                 (value_type *)local_568);
      cmDyndepObjectInfo::~cmDyndepObjectInfo((cmDyndepObjectInfo *)local_568);
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      std::operator+(&local_4f0,"-E cmake_ninja_dyndep failed to parse ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ddio.limit_);
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_510,(Reader *)local_4b0);
      std::operator+(&local_4d0,&local_4f0,&local_510);
      cmSystemTools::Error(&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4f0);
      this_local._7_1_ = 0;
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    Json::Reader::~Reader((Reader *)local_4b0);
    std::ifstream::~ifstream(&reader.features_);
    Json::Value::~Value((Value *)&ddi);
    if (info.Requires.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_003a3b50;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(linked_target_dirs);
  linked_target_dir =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(linked_target_dirs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&linked_target_dir), bVar1) {
    ltmn.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ltm.limit_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ltmn.field_2._8_8_,"/");
    std::operator+(&local_708,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ltm.limit_,
                   arg_lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8,
                   &local_708,"Modules.json");
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&ltm.limit_);
    Json::Value::Value((Value *)local_750,nullValue);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&reader_1.features_,pcVar4,_Var3);
    Json::Reader::Reader((Reader *)local_a68);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&reader_1.features_.allowComments_ +
                              *(long *)(reader_1._264_8_ + -0x18)));
    if ((!bVar1) ||
       (bVar1 = Json::Reader::parse((Reader *)local_a68,(istream *)&reader_1.features_,
                                    (Value *)local_750,false), bVar1)) {
      bVar1 = Json::Value::isObject((Value *)local_750);
      if (bVar1) {
        Json::Value::begin((Value *)local_ad8);
        while( true ) {
          Json::Value::end((Value *)local_ae8);
          bVar1 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)local_ad8,(SelfType *)local_ae8);
          if (!bVar1) break;
          this_02 = Json::ValueIterator::operator->((ValueIterator *)local_ad8);
          Json::Value::asString_abi_cxx11_(&local_b08,this_02);
          Json::ValueIteratorBase::key((Value *)&tm.limit_,(ValueIteratorBase *)local_ad8);
          Json::Value::asString_abi_cxx11_(&local_b28,(Value *)&tm.limit_);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range1_1,&local_b28);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b08);
          std::__cxx11::string::~string((string *)&local_b28);
          Json::Value::~Value((Value *)&tm.limit_);
          std::__cxx11::string::~string((string *)&local_b08);
          Json::ValueIterator::operator++((ValueIterator *)local_ad8);
        }
      }
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      std::operator+(&local_aa8,"-E cmake_ninja_dyndep failed to parse ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ltmn.field_2._8_8_);
      Json::Reader::getFormattedErrorMessages_abi_cxx11_
                ((string *)&i.super_ValueIteratorBase.isNull_,(Reader *)local_a68);
      std::operator+(&local_a88,&local_aa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &i.super_ValueIteratorBase.isNull_);
      cmSystemTools::Error(&local_a88);
      std::__cxx11::string::~string((string *)&local_a88);
      std::__cxx11::string::~string((string *)&i.super_ValueIteratorBase.isNull_);
      std::__cxx11::string::~string((string *)&local_aa8);
      this_local._7_1_ = 0;
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    Json::Reader::~Reader((Reader *)local_a68);
    std::ifstream::~ifstream(&reader_1.features_);
    Json::Value::~Value((Value *)local_750);
    std::__cxx11::string::~string((string *)local_6e8);
    if (info.Requires.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_003a3b34;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  Json::Value::Value((Value *)&__range1_2,objectValue);
  __end1_2 = std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::begin
                       ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1
                       );
  object = (cmDyndepObjectInfo *)
           std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::end
                     ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
                             *)&object), bVar1) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
             ::operator*(&__end1_2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pcVar7->Provides);
    p = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&pcVar7->Provides);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&p), bVar1) {
      mod.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bd8,
                     module_dir,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     mod.field_2._8_8_);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__range1_1,(key_type *)mod.field_2._8_8_);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)local_bd8);
      Json::Value::Value((Value *)&ddf.field_0x240,(string *)local_bd8);
      pVVar6 = Json::Value::operator[]((Value *)&__range1_2,(string *)mod.field_2._8_8_);
      Json::Value::operator=(pVVar6,(Value *)&ddf.field_0x240);
      Json::Value::~Value((Value *)&ddf.field_0x240);
      std::__cxx11::string::~string((string *)local_bd8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
    ::operator++(&__end1_2);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&build.RspFile.field_2 + 8),
             (string *)snapshot.Position.Position,false,None);
  std::operator<<((ostream *)((long)&build.RspFile.field_2 + 8),"ninja_dyndep_version = 1.0\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f70,"dyndep",(allocator<char> *)((long)&__range1_3 + 7));
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_f50,&local_f70);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             (build.Rule.field_2._M_local_buf + 8),(char (*) [1])0x8d3ee0);
  __end1_3 = std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::begin
                       ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1
                       );
  object_1 = (cmDyndepObjectInfo *)
             std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::end
                       ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1
                       );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
                             *)&object_1), bVar1) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
             ::operator*(&__end1_3);
    this_03 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&build.Rule.field_2 + 8),0);
    std::__cxx11::string::operator=((string *)this_03,(string *)pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&build.Outputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pcVar7->Provides);
    p_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&pcVar7->Provides);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&p_1), bVar1) {
      __k = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2_1);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__range1_1,__k);
      psVar10 = ConvertToNinjaPath(this,pmVar8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&build.Outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar10);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&build.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pcVar7->Requires);
    r = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&pcVar7->Requires);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&r), bVar1) {
      mit._M_node = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2_2);
      local_fe0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range1_1,(key_type *)mit._M_node);
      local_fe8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range1_1);
      bVar1 = std::operator!=(&local_fe0,&local_fe8);
      if (bVar1) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_fe0);
        psVar10 = ConvertToNinjaPath(this,&ppVar9->second);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&build.ExplicitDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar10);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&build.OrderOnlyDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pcVar7->Provides);
    if (!bVar1) {
      pVar12 = std::
               map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::emplace<char_const(&)[7],char_const(&)[2]>
                         ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&build.OrderOnlyDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (char (*) [7])"restat",(char (*) [2])0x8e5758);
      target_mods_file.field_2._8_8_ = pVar12.first._M_node;
    }
    WriteBuild(this,(ostream *)((long)&build.RspFile.field_2 + 8),(cmNinjaBuild *)local_f50,0,
               (bool *)0x0);
    __gnu_cxx::
    __normal_iterator<cmDyndepObjectInfo_*,_std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>_>
    ::operator++(&__end1_3);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_f50);
  cmsys::SystemTools::GetFilenamePath
            ((string *)&tmf.field_0x240,(string *)snapshot.Position.Position);
  std::operator+(&local_1058,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tmf.field_0x240,"/");
  std::operator+(&local_1038,&local_1058,arg_lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1018,
                 &local_1038,"Modules.json");
  std::__cxx11::string::~string((string *)&local_1038);
  std::__cxx11::string::~string((string *)&local_1058);
  std::__cxx11::string::~string((string *)&tmf.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_12c0,(string *)local_1018,false,None);
  Json::operator<<((ostream *)local_12c0,(Value *)&__range1_2);
  this_local._7_1_ = 1;
  info.Requires.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_12c0);
  std::__cxx11::string::~string((string *)local_1018);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&build.RspFile.field_2 + 8));
  Json::Value::~Value((Value *)&__range1_2);
LAB_003a3b34:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range1_1);
LAB_003a3b50:
  std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::~vector
            ((vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::string const& arg_lang)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    std::unique_ptr<cmLocalNinjaGenerator> lgd(
      static_cast<cmLocalNinjaGenerator*>(
        this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmDyndepObjectInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(arg_ddi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_ddi +
                           reader.getFormattedErrorMessages());
      return false;
    }

    cmDyndepObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (auto const& ddi_provide : ddi_provides) {
        info.Provides.push_back(ddi_provide.asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (auto const& ddi_require : ddi_requires) {
        info.Requires.push_back(ddi_require.asString());
      }
    }
    objects.push_back(std::move(info));
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      linked_target_dir + "/" + arg_lang + "Modules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " +
                           linked_target_dir +
                           reader.getFormattedErrorMessages());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (cmDyndepObjectInfo const& object : objects) {
    for (std::string const& p : object.Provides) {
      std::string const mod = module_dir + p;
      mod_files[p] = mod;
      tm[p] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmDyndepObjectInfo const& object : objects) {
      build.Outputs[0] = object.Object;
      build.ImplicitOuts.clear();
      for (std::string const& p : object.Provides) {
        build.ImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[p]));
      }
      build.ImplicitDeps.clear();
      for (std::string const& r : object.Requires) {
        auto mit = mod_files.find(r);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(this->ConvertToNinjaPath(mit->second));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      this->WriteBuild(ddf, build);
    }
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/" + arg_lang + "Modules.json";
  cmGeneratedFileStream tmf(target_mods_file);
  tmf << tm;

  return true;
}